

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,int variable,TPZVec<double> *value)

{
  ostream *poVar1;
  TPZGeoEl *pTVar2;
  TPZCompElSide *this_00;
  TPZCompEl *pTVar3;
  long *in_RDI;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZVec<int> nshape;
  TPZVec<TPZMaterialDataT<double>_> datavec;
  int64_t nref;
  TPZMaterial *material;
  int64_t in_stack_ffffffffffffff38;
  TPZMaterialDataT<double> *in_stack_ffffffffffffff40;
  TPZCompEl *in_stack_ffffffffffffff48;
  TPZVec<TPZMaterialDataT<double>_> *this_01;
  long *in_stack_ffffffffffffff78;
  long *plVar4;
  long from;
  double *in_stack_ffffffffffffff88;
  TPZVec<double> *in_stack_ffffffffffffff90;
  TPZVec<TPZMaterialDataT<double>_> local_48;
  int64_t local_28;
  long local_20;
  
  local_20 = (**(code **)(*in_RDI + 0xb8))();
  if (local_20 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar1 = std::operator<<(poVar1,
                             "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate(int, TPZVec<STATE> &) [TGeometry = pzgeom::TPZGeoTetrahedra]"
                            );
    std::operator<<(poVar1," : no material for this element\n");
  }
  else {
    pTVar2 = TPZCompEl::Reference(in_stack_ffffffffffffff48);
    if (pTVar2 == (TPZGeoEl *)0x0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Error at ");
      poVar1 = std::operator<<(poVar1,
                               "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Integrate(int, TPZVec<STATE> &) [TGeometry = pzgeom::TPZGeoTetrahedra]"
                              );
      std::operator<<(poVar1," : no reference element\n");
    }
    else {
      local_28 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
      this_01 = &local_48;
      TPZVec<TPZMaterialDataT<double>_>::TPZVec(this_01);
      TPZVec<TPZMaterialDataT<double>_>::resize
                ((TPZVec<TPZMaterialDataT<double>_> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      for (from = 0; from < local_28; from = from + 1) {
        this_00 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),from);
        pTVar3 = TPZCompElSide::Element(this_00);
        if (pTVar3 == (TPZCompEl *)0x0) {
          in_stack_ffffffffffffff78 = (long *)0x0;
        }
        else {
          in_stack_ffffffffffffff78 =
               (long *)__dynamic_cast(pTVar3,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0
                                     );
        }
        if (in_stack_ffffffffffffff78 != (long *)0x0) {
          plVar4 = in_stack_ffffffffffffff78;
          in_stack_ffffffffffffff40 = TPZVec<TPZMaterialDataT<double>_>::operator[](&local_48,from);
          (**(code **)(*in_stack_ffffffffffffff78 + 0x298))
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff78 = plVar4;
        }
      }
      TPZVec<double>::Fill
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,from,
                 (int64_t)in_stack_ffffffffffffff78);
      TPZVec<int>::~TPZVec((TPZVec<int> *)in_stack_ffffffffffffff40);
      TPZVec<TPZMaterialDataT<double>_>::~TPZVec(this_01);
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::Integrate(int variable, TPZVec<STATE> & value){
    TPZMaterial * material = this->Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " : no material for this element\n";
        return;
    }
    if (!this->Reference()){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " : no reference element\n";
        return;
    }
    
    int64_t nref = fElementVec.size();
    TPZVec<TPZMaterialDataT<STATE>> datavec;
    datavec.resize(nref);
    
#ifdef PZDEBUG
    if (nref != datavec.size()) {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " The number of materials can not be different from the size of the fElementVec !\n";
        DebugStop();
    }
#endif
    
    TPZVec<int> nshape(nref);
    for (int64_t iref = 0; iref<nref; iref++)
    {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(!msp) continue;
        msp->InitMaterialData(datavec[iref]);
    }
    
    
    //	TPZManVector<REAL, 3> intpoint(dim,0.);
    //	const int varsize = material->NSolutionVariables(variable);
    //	value.Resize(varsize);
    value.Fill(0.);
    //
    //	const TPZIntPoints &intrule = this->GetIntegrationRule();
    //	int npoints = intrule.NPoints(), ip, iv;
    //	TPZManVector<REAL> sol(varsize);
    //	for(ip=0;ip<npoints;ip++){
    //		intrule.Point(ip,intpoint,weight);
    //		sol.Fill(0.);
    //		this->Solution(intpoint, variable, sol);
    //		//Tiago: Next call is performed only for computing detcaj. The previous method (Solution) has already computed jacobian.
    //		//       It means that the next call would not be necessary if I wrote the whole code here.
    //		this->Reference()->Jacobian(intpoint, data.jacobian, data.axes, data.detjac, data.jacinv);
    //		weight *= fabs(data.detjac);
    //		for(iv = 0; iv < varsize; iv++) {
    //#if !BUILD_COMPLEX_PROJECTS
    //			DebugStop();
    //#else
    //			value[iv] += sol[iv]*weight;
    //#endif
    //		}//for iv
    //	}//for ip
}